

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

wchar_t is_padding_changed(term *t,wchar_t y,wchar_t x)

{
  term_win *ptVar1;
  term_win *ptVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = (uint)tile_width + x;
  if (t->wid <= (uint)tile_width + x) {
    iVar3 = t->wid;
  }
  iVar4 = (uint)tile_height + y;
  if (t->hgt <= (uint)tile_height + y) {
    iVar4 = t->hgt;
  }
  lVar5 = (long)y;
  lVar6 = (long)x;
  while (lVar6 = lVar6 + 1, lVar6 < iVar3) {
    ptVar1 = t->scr;
    if (ptVar1->a[lVar5][lVar6] == 0xff) {
      ptVar2 = t->old;
      if (ptVar2->a[lVar5][lVar6] != 0xff) {
        return L'\x01';
      }
      if (ptVar1->c[lVar5][lVar6] != ptVar2->c[lVar5][lVar6]) {
        return L'\x01';
      }
      if (ptVar1->ta[lVar5][lVar6] != ptVar2->ta[lVar5][lVar6]) {
        return L'\x01';
      }
      if (ptVar1->tc[lVar5][lVar6] != ptVar2->tc[lVar5][lVar6]) {
        return L'\x01';
      }
    }
  }
  do {
    lVar5 = lVar5 + 1;
    lVar6 = (long)x;
    if (iVar4 <= lVar5) {
      return L'\0';
    }
    for (; lVar6 < iVar3; lVar6 = lVar6 + 1) {
      ptVar1 = t->scr;
      if (ptVar1->a[lVar5][lVar6] == 0xff) {
        ptVar2 = t->old;
        if (ptVar2->a[lVar5][lVar6] != 0xff) {
          return L'\x01';
        }
        if (ptVar1->c[lVar5][lVar6] != ptVar2->c[lVar5][lVar6]) {
          return L'\x01';
        }
        if (ptVar1->ta[lVar5][lVar6] != ptVar2->ta[lVar5][lVar6]) {
          return L'\x01';
        }
        if (ptVar1->tc[lVar5][lVar6] != ptVar2->tc[lVar5][lVar6]) {
          return L'\x01';
        }
      }
    }
  } while( true );
}

Assistant:

static int is_padding_changed(term *t, int y, int x)
{
	int xsl = MIN(x + tile_width, t->wid);
	int ysl = MIN(y + tile_height, t->hgt);
	int xs, ys;

	for (xs = x + 1; xs < xsl; ++xs) {
		if (t->scr->a[y][xs] == 255 &&
				(t->scr->a[y][xs] != t->old->a[y][xs] ||
				t->scr->c[y][xs] != t->old->c[y][xs] ||
				t->scr->ta[y][xs] != t->old->ta[y][xs] ||
				t->scr->tc[y][xs] != t->old->tc[y][xs])) {
			return 1;
		}
	}
	for (ys = y + 1; ys < ysl; ++ys) {
		for (xs = x; xs < xsl; ++xs) {
			if (t->scr->a[ys][xs] == 255 &&
					(t->scr->a[ys][xs] != t->old->a[ys][xs] ||
					t->scr->c[ys][xs] != t->old->c[ys][xs] ||
					t->scr->ta[ys][xs] != t->old->ta[ys][xs] ||
					t->scr->tc[ys][xs] != t->old->tc[ys][xs])) {
				return 1;
			}
		}
	}
	return 0;
}